

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.h
# Opt level: O3

void __thiscall
Nova::Grid_Iterator<float,_3>::Add_Region(Grid_Iterator<float,_3> *this,Range<int,_3> *region_input)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  Vector<int,_3,_true> data_copy;
  
  data_copy._data._M_elems[2] = (region_input->max_corner)._data._M_elems[2];
  data_copy._data._M_elems._0_8_ = *(undefined8 *)(region_input->max_corner)._data._M_elems;
  lVar5 = 0;
  do {
    piVar1 = (int *)((long)data_copy._data._M_elems + lVar5);
    *piVar1 = *piVar1 - *(int *)((long)(region_input->min_corner)._data._M_elems + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  bVar4 = data_copy._data._M_elems[1] < data_copy._data._M_elems[0];
  if (data_copy._data._M_elems[1] < data_copy._data._M_elems[0]) {
    data_copy._data._M_elems[0] = data_copy._data._M_elems[1];
  }
  lVar5 = 8;
  if (data_copy._data._M_elems[0] <= data_copy._data._M_elems[2]) {
    lVar5 = (ulong)bVar4 << 2;
  }
  if (-1 < *(int *)((long)data_copy._data._M_elems + lVar5)) {
    iVar2 = this->number_of_regions;
    this->number_of_regions = iVar2 + 1;
    if (this->regions + iVar2 != region_input) {
      uVar3 = *(undefined8 *)(region_input->min_corner)._data._M_elems;
      this->regions[iVar2].min_corner._data._M_elems[2] =
           (region_input->min_corner)._data._M_elems[2];
      *(undefined8 *)this->regions[iVar2].min_corner._data._M_elems = uVar3;
      uVar3 = *(undefined8 *)(region_input->max_corner)._data._M_elems;
      this->regions[iVar2].max_corner._data._M_elems[2] =
           (region_input->max_corner)._data._M_elems[2];
      *(undefined8 *)this->regions[iVar2].max_corner._data._M_elems = uVar3;
    }
  }
  return;
}

Assistant:

TV Edge_Lengths() const
    {
        return max_corner-min_corner;
    }